

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  byte closure_char;
  uint uVar1;
  pointer pbVar2;
  pointer pCVar3;
  bool bVar4;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *pvVar5;
  bool bVar6;
  __type _Var7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  istream *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined7 extraout_var;
  iterator iVar17;
  char cVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  size_t start;
  pointer str;
  char cVar19;
  string *str_00;
  bool bVar20;
  ulong local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  undefined1 local_2a8 [8];
  string l2;
  undefined1 local_280 [4];
  uint local_27c;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_278;
  uint local_270;
  int local_26c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  string name;
  string currentSection;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  string buffer;
  string line_sep_chars;
  string previousSection;
  string local_150 [4];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  local_278 = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)&currentSection,"default",(allocator *)&previousSection);
  ::std::__cxx11::string::string((string *)&previousSection,"default",(allocator *)&line_sep_chars);
  (local_278->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_278->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_278->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar19 = this->arrayStart;
  local_270 = (uint)cVar19;
  cVar18 = this->arrayEnd;
  local_26c = (int)cVar18;
  if (cVar18 == ']' && cVar19 == '[') {
    bVar20 = this->arraySeparator == ',';
  }
  else if ((local_270 & 0xdf) == 0) {
    if (cVar19 == cVar18) {
      bVar20 = false;
      local_26c = 0x5d;
      bVar4 = true;
      local_270 = 0x5b;
      goto LAB_00108c82;
    }
    bVar20 = false;
  }
  else {
    bVar20 = false;
  }
  bVar4 = false;
LAB_00108c82:
  cVar19 = this->arraySeparator;
  cVar18 = ',';
  if (cVar19 != ' ') {
    cVar18 = cVar19;
  }
  if (!bVar4) {
    cVar18 = cVar19;
  }
  line_sep_chars.field_2._M_local_buf[0] = this->parentSeparatorChar;
  line_sep_chars.field_2._M_local_buf[1] = this->commentChar;
  line_sep_chars.field_2._M_local_buf[2] = this->valueDelimiter;
  line_sep_chars._M_dataplus._M_p = (pointer)&line_sep_chars.field_2;
  line_sep_chars._M_string_length = 3;
  line_sep_chars.field_2._M_local_buf[3] = '\0';
  iVar11 = 0;
  bVar6 = false;
  do {
    piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (input,(string *)&buffer);
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
      bVar20 = ::std::operator!=(&currentSection,"default");
      if (bVar20) {
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>(local_278);
        detail::generate_parents(&parents,&currentSection,&name,this->parentSeparatorChar);
        pvVar5 = local_278;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&(local_278->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parents);
        ::std::__cxx11::string::assign
                  ((char *)&(pvVar5->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1].name);
        pvVar5 = local_278;
        while (pCVar3 = (pvVar5->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish,
              0x20 < (ulong)((long)pCVar3[-1].parents.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pCVar3[-1].parents.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (pvVar5,pCVar3 + -1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&(pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1].parents);
        }
        ::std::__cxx11::string::~string((string *)&name);
      }
      ::std::__cxx11::string::~string((string *)&line_sep_chars);
      ::std::__cxx11::string::~string((string *)&previousSection);
      ::std::__cxx11::string::~string((string *)&currentSection);
      ::std::__cxx11::string::~string((string *)&buffer);
      ::std::__cxx11::string::~string((string *)&line);
      return local_278;
    }
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    detail::trim_copy((string *)&parents,&buffer);
    ::std::__cxx11::string::operator=((string *)&line,(string *)&parents);
    ::std::__cxx11::string::~string((string *)&parents);
    if (2 < line._M_string_length) {
      iVar10 = ::std::__cxx11::string::compare((ulong)&line,0,(char *)0x3);
      if ((iVar10 == 0) ||
         (iVar10 = ::std::__cxx11::string::compare((ulong)&line,0,(char *)0x3), iVar10 == 0)) {
        cVar19 = *line._M_dataplus._M_p;
        do {
          piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (input,(string *)&line);
          if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
          detail::trim(&line);
          bVar9 = detail::hasMLString(&line,cVar19);
        } while (!bVar9);
      }
      else {
        cVar19 = *line._M_dataplus._M_p;
        if ((cVar19 != '#') && (cVar19 != ';')) {
          if ((cVar19 == '[') && (line._M_dataplus._M_p[line._M_string_length - 1] == ']')) {
            bVar6 = ::std::operator!=(&currentSection,"default");
            if (bVar6) {
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                        (local_278);
              detail::generate_parents(&parents,&currentSection,&name,this->parentSeparatorChar);
              pvVar5 = local_278;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&(local_278->
                                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                )._M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&parents);
              ::std::__cxx11::string::assign
                        ((char *)&(pvVar5->
                                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1].name);
            }
            ::std::__cxx11::string::substr((ulong)&parents,(ulong)&line);
            ::std::__cxx11::string::operator=((string *)&currentSection,(string *)&parents);
            ::std::__cxx11::string::~string((string *)&parents);
            if (((1 < currentSection._M_string_length) && (*currentSection._M_dataplus._M_p == '['))
               && (currentSection._M_dataplus._M_p[currentSection._M_string_length - 1] == ']')) {
              ::std::__cxx11::string::substr((ulong)&parents,(ulong)&currentSection);
              ::std::__cxx11::string::operator=((string *)&currentSection,(string *)&parents);
              ::std::__cxx11::string::~string((string *)&parents);
            }
            ::std::__cxx11::string::string((string *)local_150,(string *)&currentSection);
            detail::to_lower((string *)&parents,local_150);
            bVar6 = ::std::operator==((string *)&parents,"default");
            ::std::__cxx11::string::~string((string *)&parents);
            ::std::__cxx11::string::~string((string *)local_150);
            if (bVar6) {
              ::std::__cxx11::string::assign((char *)&currentSection);
            }
            else {
              detail::checkParentSegments(local_278,&currentSection,this->parentSeparatorChar);
            }
            _Var7 = ::std::operator==(&currentSection,&previousSection);
            if (_Var7) {
              iVar11 = iVar11 + 1;
              bVar6 = false;
            }
            else {
              iVar11 = 0;
              ::std::__cxx11::string::_M_assign((string *)&previousSection);
              bVar6 = false;
            }
          }
          else if (cVar19 != this->commentChar) {
            lVar13 = ::std::__cxx11::string::find_first_of((char *)&line,0x123e69);
            if (lVar13 != -1) {
              start = 0;
              while (start < line._M_string_length) {
                closure_char = line._M_dataplus._M_p[start];
                if ((closure_char - 0x22 < 0x3f) &&
                   ((0x4000000000000021U >> ((ulong)(closure_char - 0x22) & 0x3f) & 1) != 0)) {
                  start = detail::close_sequence(&line,start,closure_char);
LAB_0010903a:
                  start = start + 1;
                }
                else {
                  if ((closure_char == this->valueDelimiter) || (closure_char == this->commentChar))
                  break;
                  if (((closure_char == 9) || (closure_char == 0x20)) ||
                     (closure_char == this->parentSeparatorChar)) goto LAB_0010903a;
                  start = ::std::__cxx11::string::find_first_of
                                    ((string *)&line,(ulong)&line_sep_chars);
                }
              }
            }
            cVar19 = (char)&line;
            uVar14 = ::std::__cxx11::string::find(cVar19,(ulong)(uint)(int)this->valueDelimiter);
            uVar15 = ::std::__cxx11::string::find(cVar19,(ulong)(uint)(int)this->commentChar);
            if (uVar14 == 0xffffffffffffffff || uVar15 < uVar14) {
              ::std::__cxx11::string::substr((ulong)&l2,(ulong)&line);
              detail::trim_copy((string *)&parents,&l2);
              ::std::__cxx11::string::operator=((string *)&name,(string *)&parents);
              ::std::__cxx11::string::~string((string *)&parents);
              ::std::__cxx11::string::~string((string *)&l2);
              ::std::__cxx11::string::string((string *)&parents,"true",(allocator *)&l2);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &items_buffer,(string *)&parents,local_2a8);
            }
            else {
              ::std::__cxx11::string::substr((ulong)&l2,(ulong)&line);
              detail::trim_copy((string *)&parents,&l2);
              ::std::__cxx11::string::operator=((string *)&name,(string *)&parents);
              ::std::__cxx11::string::~string((string *)&parents);
              ::std::__cxx11::string::~string((string *)&l2);
              ::std::__cxx11::string::substr((ulong)&l2,(ulong)&line);
              detail::trim_copy((string *)&parents,&l2);
              ::std::__cxx11::string::~string((string *)&l2);
              iVar10 = ::std::__cxx11::string::compare((ulong)&parents,0,(char *)0x3);
              if (iVar10 == 0) {
LAB_00109267:
                cVar19 = *(char *)&((parents.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
                ::std::__cxx11::string::substr((ulong)&l2,(ulong)&buffer);
                ::std::__cxx11::string::operator=((string *)&parents,(string *)&l2);
                ::std::__cxx11::string::~string((string *)&l2);
                detail::ltrim((string *)&parents);
                ::std::__cxx11::string::erase((ulong)&parents,0);
                if ((parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
                   ((parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                    [(long)parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish] != '\\')) {
                  bVar9 = detail::hasMLString((string *)&parents,cVar19);
                  uVar14 = CONCAT71(extraout_var,bVar9);
                  if (bVar9) {
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    uVar14 = ::std::__cxx11::string::pop_back();
                    local_2d8 = 0;
                    bVar9 = false;
                    if (cVar19 == '\"') {
                      detail::remove_escaped_characters(&l2,(string *)&parents);
                      ::std::__cxx11::string::operator=((string *)&parents,(string *)&l2);
                      uVar14 = ::std::__cxx11::string::~string((string *)&l2);
                      local_2d8 = 0;
                      bVar9 = false;
                    }
                  }
                  else {
                    bVar9 = true;
                    local_2d8 = 0;
                  }
                }
                else {
                  uVar16 = ::std::__cxx11::string::pop_back();
                  uVar14 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
                  local_2d8 = uVar14 & 0xffffffff;
                  bVar9 = true;
                }
                local_27c = (uint)CONCAT71((int7)(uVar14 >> 8),1);
                do {
                  if (!bVar9) break;
                  l2._M_dataplus._M_p = (pointer)&l2.field_2;
                  l2._M_string_length = 0;
                  l2.field_2._M_local_buf[0] = '\0';
                  piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (input,(string *)&l2);
                  uVar1 = *(uint *)(piVar12 + *(long *)(*(long *)piVar12 + -0x18) + 0x20);
                  bVar9 = true;
                  if ((uVar1 & 5) == 0) {
                    ::std::__cxx11::string::_M_assign((string *)&line);
                    detail::rtrim(&line);
                    bVar8 = detail::hasMLString(&line,cVar19);
                    if (bVar8) {
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      if ((local_2d8 & 1) == 0) {
                        if (((local_27c & 1) == 0) ||
                           (parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back((char)&parents);
                        }
                      }
                      else {
                        detail::ltrim(&line);
                      }
                      ::std::__cxx11::string::append((string *)&parents);
                      if ((parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) &&
                         ((parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                          [(long)parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish] == '\n')) {
                        ::std::__cxx11::string::pop_back();
                      }
                      if (cVar19 == '\"') {
                        detail::remove_escaped_characters((string *)&citems,(string *)&parents);
                        ::std::__cxx11::string::operator=((string *)&parents,(string *)&citems);
                        ::std::__cxx11::string::~string((string *)&citems);
                      }
                      local_27c = 0;
                      bVar9 = false;
                    }
                    else {
                      if ((local_2d8 & 1) == 0) {
                        if (((local_27c & 1) == 0) ||
                           (parents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back((char)&parents);
                        }
                      }
                      else {
                        detail::trim(&l2);
                      }
                      if ((l2._M_string_length == 0) ||
                         (l2._M_dataplus._M_p[l2._M_string_length - 1] != '\\')) {
                        local_2d8 = 0;
                      }
                      else {
                        ::std::__cxx11::string::pop_back();
                        local_2d8 = 1;
                      }
                      ::std::__cxx11::string::append((string *)&parents);
                      local_27c = 0;
                    }
                  }
                  ::std::__cxx11::string::~string((string *)&l2);
                } while ((uVar1 & 5) == 0);
                ::std::__cxx11::string::string((string *)&l2,(string *)&parents);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &items_buffer,&l2,local_280);
LAB_00109772:
                str_00 = &l2;
              }
              else {
                iVar10 = ::std::__cxx11::string::compare((ulong)&parents,0,(char *)0x3);
                if (uVar15 == 0xffffffffffffffff || iVar10 == 0) {
                  if (iVar10 == 0) goto LAB_00109267;
                }
                else {
                  ::std::__cxx11::string::string((string *)&local_50,(string *)&parents);
                  detail::split_up(&citems,&local_50,this->commentChar);
                  ::std::__cxx11::string::~string((string *)&local_50);
                  detail::trim_copy(&l2,citems.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                  ::std::__cxx11::string::operator=((string *)&parents,(string *)&l2);
                  ::std::__cxx11::string::~string((string *)&l2);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&citems);
                }
                if ((parents.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x2) ||
                   (local_270 !=
                    (int)*(char *)&((parents.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p))
                {
                  if (!bVar20 && !bVar4) {
LAB_0010974b:
                    ::std::__cxx11::string::string((string *)&l2,(string *)&parents);
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_assign_aux<std::__cxx11::string_const*>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &items_buffer,&l2,local_280);
                    goto LAB_00109772;
                  }
                  cVar19 = (char)(string *)&parents;
                  lVar13 = ::std::__cxx11::string::find(cVar19,(ulong)(uint)(int)cVar18);
                  if (lVar13 == -1) {
                    lVar13 = ::std::__cxx11::string::find(cVar19,0x20);
                    if (lVar13 == -1) goto LAB_0010974b;
                    str_00 = &local_d0;
                    ::std::__cxx11::string::string((string *)str_00,(string *)&parents);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,'\0');
                  }
                  else {
                    str_00 = &local_b0;
                    ::std::__cxx11::string::string((string *)str_00,(string *)&parents);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,cVar18);
                  }
                }
                else {
                  l2._M_dataplus._M_p = (pointer)&l2.field_2;
                  l2._M_string_length = 0;
                  l2.field_2._M_local_buf[0] = '\0';
                  while ((local_26c !=
                          (parents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                          [(long)parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish] &&
                         (piVar12 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                              (input,(string *)&l2),
                         ((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0))) {
                    detail::trim(&l2);
                    ::std::__cxx11::string::append((string *)&parents);
                  }
                  ::std::__cxx11::string::~string((string *)&l2);
                  if (local_26c ==
                      (parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                      [(long)parents.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish]) {
                    str_00 = &local_70;
                    ::std::__cxx11::string::substr((ulong)str_00,(ulong)&parents);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,cVar18);
                  }
                  else {
                    str_00 = &local_90;
                    ::std::__cxx11::string::substr((ulong)str_00,(ulong)&parents);
                    detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&l2,str_00,cVar18);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign(&items_buffer,&l2);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&l2);
              }
              ::std::__cxx11::string::~string((string *)str_00);
            }
            ::std::__cxx11::string::~string((string *)&parents);
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            parents.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            detail::generate_parents
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&l2,&currentSection,&name,this->parentSeparatorChar);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&parents,&l2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&l2);
            detail::process_quoted_string(&name,'\"','\'');
            pbVar2 = items_buffer.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (str = items_buffer.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; str != pbVar2; str = str + 1) {
              detail::process_quoted_string(str,this->stringQuote,this->literalQuote);
            }
            if ((ulong)((long)parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <=
                (ulong)this->maximumLayers) {
              if ((this->configSection)._M_string_length != 0 && !bVar6) {
                if (((parents.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      parents.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) ||
                    (bVar6 = ::std::operator!=(parents.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                               &this->configSection), bVar6)) ||
                   (iVar11 != this->configIndex && -1 < this->configIndex)) {
                  bVar6 = false;
                  goto LAB_001099fb;
                }
                bVar6 = true;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(&parents,(const_iterator)
                                 parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              }
              pvVar5 = local_278;
              iVar17 = detail::find_matching_config
                                 (local_278,&parents,&name,this->allowMultipleDuplicateFields);
              if (iVar17._M_current ==
                  (pvVar5->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
                std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                          (pvVar5);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign(&(pvVar5->
                                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
                ::std::__cxx11::string::operator=
                          ((string *)
                           &(pvVar5->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1].name,(string *)&name);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign(&(pvVar5->
                                  super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1].inputs,
                                 &items_buffer);
              }
              else {
                pbVar2 = ((iVar17._M_current)->inputs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (((((0x20 < (ulong)((long)pbVar2 -
                                      (long)((iVar17._M_current)->inputs).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)) &&
                      (0x20 < (ulong)((long)items_buffer.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)items_buffer.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start))) ||
                     (this->allowMultipleDuplicateFields == true)) &&
                    ((pbVar2[-1]._M_string_length != 0 &&
                     ((items_buffer.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0)))) &&
                   ((bVar9 = ::std::operator==(pbVar2 + -1,"%%"), !bVar9 &&
                    (bVar9 = ::std::operator==(items_buffer.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,"%%"),
                    !bVar9)))) {
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[3]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &(iVar17._M_current)->inputs,(char (*) [3])"%%");
                  (iVar17._M_current)->multiline = true;
                }
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &(iVar17._M_current)->inputs,
                           ((iVar17._M_current)->inputs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )items_buffer.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )items_buffer.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
              }
            }
LAB_001099fb:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&parents);
          }
        }
      }
    }
    ::std::__cxx11::string::~string((string *)&name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&items_buffer);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // multiline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        auto match = detail::find_matching_config(output, parents, name, allowMultipleDuplicateFields);
        if(match != output.end()) {
            if((match->inputs.size() > 1 && items_buffer.size() > 1) || allowMultipleDuplicateFields) {
                // insert a separator if one is not already present
                if(!(match->inputs.back().empty() || items_buffer.front().empty() || match->inputs.back() == "%%" ||
                     items_buffer.front() == "%%")) {
                    match->inputs.emplace_back("%%");
                    match->multiline = true;
                }
            }
            match->inputs.insert(match->inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}